

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O3

void test_convert<signed_char,float>(uint length,char value)

{
  float fVar1;
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int i;
  int iVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint uVar7;
  float fVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<signed_char> pt;
  shared_ptr<float> pu;
  
  __n = (ulong)length;
  iVar4 = posix_memalign(&pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi,0x10,(long)(int)length);
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar4 == 0) {
    local_50 = pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,local_50,
             sse::common::free<signed_char>);
  iVar4 = posix_memalign(&local_58,0x10,(long)(int)length << 2);
  pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar4 == 0) {
    pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<float>);
  _Var3._M_pi = pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var2 = local_50;
  if (0 < (int)length) {
    memset(local_50,(uint)(byte)value,__n);
    uVar5 = 0;
    do {
      *(float *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar5 * 4) =
           (float)(int)*(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar5);
      uVar5 = uVar5 + 1;
    } while (__n != uVar5);
  }
  if (length != 0) {
    uVar5 = 0;
    do {
      fVar1 = *(float *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar5 * 4);
      fVar8 = fVar1 - (float)(int)value;
      uVar7 = -(uint)(fVar8 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar7 & (uint)fVar8 | (uint)((float)(int)value - fVar1) & uVar7)
         ) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_convert(unsigned int, _T) [_T = signed char, _U = float]";
        *(undefined4 *)(puVar6 + 1) = 0x17;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar5 = uVar5 + 1;
    } while (__n != uVar5);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}